

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O3

int Fraig_ManPrintRefs(Fraig_Man_t *pMan)

{
  Fraig_Node_t *pNode2;
  int iVar1;
  Fraig_NodeVec_t *p;
  Fraig_NodeVec_t *pFVar2;
  long lVar3;
  long lVar4;
  Fraig_Node_t *pNew;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  Fraig_Node_t *pFVar9;
  uint uVar10;
  timespec ts;
  uint local_64;
  timespec local_40;
  
  p = Fraig_NodeVecAlloc(1000);
  pFVar2 = pMan->vNodes;
  uVar8 = (ulong)(uint)pFVar2->nSize;
  if (0 < pFVar2->nSize) {
    lVar5 = 0;
    do {
      pFVar9 = pFVar2->pArray[lVar5];
      if (((0xfff < *(uint *)&pFVar9->field_0x18) &&
          (*(uint *)&pFVar9->field_0x18 >> 0xc != pMan->nWordsRand << 5)) && (5 < pFVar9->nRefs)) {
        Fraig_NodeVecPush(p,pFVar9);
        pFVar2 = pMan->vNodes;
      }
      lVar5 = lVar5 + 1;
      uVar8 = (ulong)pFVar2->nSize;
    } while (lVar5 < (long)uVar8);
  }
  local_64 = 0;
  printf("Total nodes = %d. Referenced nodes = %d.\n",uVar8,(ulong)(uint)p->nSize);
  clock_gettime(3,&local_40);
  iVar1 = p->nSize;
  uVar10 = 0;
  if (0 < iVar1) {
    lVar6 = 1;
    uVar10 = 0;
    local_64 = 0;
    lVar5 = 0;
    do {
      lVar4 = lVar5 + 1;
      lVar3 = (long)iVar1;
      lVar7 = lVar6;
      if (lVar4 < lVar3) {
        do {
          pFVar9 = p->pArray[lVar5];
          pNode2 = p->pArray[lVar7];
          iVar1 = Fraig_NodeSimsContained(pMan,pFVar9,pNode2);
          pNew = pNode2;
          if ((iVar1 != 0) ||
             (iVar1 = Fraig_NodeSimsContained(pMan,pNode2,pFVar9), pNew = pFVar9, pFVar9 = pNode2,
             iVar1 != 0)) {
            iVar1 = Fraig_NodeIsImplication(pMan,pFVar9,pNew,-1);
            uVar10 = (uVar10 + 1) - (uint)(iVar1 == 0);
            local_64 = local_64 + 1;
          }
          lVar7 = lVar7 + 1;
          iVar1 = p->nSize;
        } while ((int)lVar7 < iVar1);
        lVar3 = (long)iVar1;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar4;
    } while (lVar4 < lVar3);
  }
  printf("Number of candidate pairs = %d.  Proved = %d.\n",(ulong)local_64,(ulong)uVar10);
  return 0;
}

Assistant:

int Fraig_ManPrintRefs( Fraig_Man_t * pMan )
{
    Fraig_NodeVec_t * vPivots;
    Fraig_Node_t * pNode, * pNode2;
    int i, k, Counter, nProved;
    abctime clk;

    vPivots = Fraig_NodeVecAlloc( 1000 );
    for ( i = 0; i < pMan->vNodes->nSize; i++ )
    {
        pNode = pMan->vNodes->pArray[i];

        if ( pNode->nOnes == 0 || pNode->nOnes == (unsigned)pMan->nWordsRand * 32 )
            continue;

        if ( pNode->nRefs > 5 )
        {
            Fraig_NodeVecPush( vPivots, pNode );
//            printf( "Node %6d : nRefs = %2d   Level = %3d.\n", pNode->Num, pNode->nRefs, pNode->Level );
        }
    }
    printf( "Total nodes = %d. Referenced nodes = %d.\n", pMan->vNodes->nSize, vPivots->nSize );

clk = Abc_Clock();
    // count implications
    Counter = nProved = 0;
    for ( i = 0; i < vPivots->nSize; i++ )
        for ( k = i+1; k < vPivots->nSize; k++ )
        {
            pNode  = vPivots->pArray[i];
            pNode2 = vPivots->pArray[k];
            if ( Fraig_NodeSimsContained( pMan, pNode, pNode2 ) )
            {
                if ( Fraig_NodeIsImplication( pMan, pNode, pNode2, -1 ) )
                    nProved++;
                Counter++;
            }
            else if ( Fraig_NodeSimsContained( pMan, pNode2, pNode ) )
            {
                if ( Fraig_NodeIsImplication( pMan, pNode2, pNode, -1 ) )
                    nProved++;
                Counter++;
            }
        }
    printf( "Number of candidate pairs = %d.  Proved = %d.\n", Counter, nProved );
//ABC_PRT( "Time", Abc_Clock() - clk );
    return 0;
}